

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

Float __thiscall pbrt::DebugMLTSampler::Get1D(DebugMLTSampler *this)

{
  int iVar1;
  pointer pfVar2;
  ulong uVar3;
  int va;
  size_type vb;
  
  iVar1 = (this->super_MLTSampler).sampleIndex;
  (this->super_MLTSampler).sampleIndex = iVar1 + 1;
  uVar3 = (long)(this->super_MLTSampler).streamCount * (long)iVar1 +
          (long)(this->super_MLTSampler).streamIndex;
  va = (int)uVar3;
  pfVar2 = (this->u).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  vb = (long)(this->u).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)pfVar2 >> 2;
  if (uVar3 < vb) {
    return pfVar2[uVar3];
  }
  LogFatal<char_const(&)[6],char_const(&)[9],char_const(&)[6],int&,char_const(&)[9],unsigned_long&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/samplers.h"
             ,0x241,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [6])"index",
             (char (*) [9])"u.size()",(char (*) [6])"index",&va,(char (*) [9])"u.size()",&vb);
}

Assistant:

PBRT_CPU_GPU
    Float Get1D() {
        int index = GetNextIndex();
        CHECK_LT(index, u.size());
#ifdef PBRT_IS_GPU_CODE
        return 0;
#else
        return u[index];
#endif
    }